

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_array_value(char **string,size_t nesting)

{
  JSON_Status JVar1;
  JSON_Array *array;
  ushort **ppuVar2;
  long *in_RDI;
  JSON_Array *output_array;
  JSON_Value *new_array_value;
  JSON_Value *output_value;
  JSON_Value *value;
  JSON_Array *array_00;
  JSON_Value *local_8;
  
  array_00 = (JSON_Array *)0x0;
  value = (JSON_Value *)0x0;
  local_8 = json_value_init_array();
  if (local_8 == (JSON_Value *)0x0) {
    local_8 = (JSON_Value *)0x0;
  }
  else if (*(char *)*in_RDI == '[') {
    array = json_value_get_array(value);
    *in_RDI = *in_RDI + 1;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*(byte *)*in_RDI] & 0x2000) != 0) {
      *in_RDI = *in_RDI + 1;
    }
    if (*(char *)*in_RDI == ']') {
      *in_RDI = *in_RDI + 1;
    }
    else {
      do {
        if (*(char *)*in_RDI == '\0') break;
        array_00 = (JSON_Array *)parse_value((char **)array_00,(size_t)array);
        if (array_00 == (JSON_Array *)0x0) {
          json_value_free((JSON_Value *)array);
          return (JSON_Value *)0x0;
        }
        JVar1 = json_array_add(array_00,(JSON_Value *)array);
        if (JVar1 != 0) {
          json_value_free((JSON_Value *)array);
          json_value_free((JSON_Value *)array);
          return (JSON_Value *)0x0;
        }
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*(byte *)*in_RDI] & 0x2000) != 0) {
          *in_RDI = *in_RDI + 1;
        }
        if (*(char *)*in_RDI != ',') break;
        *in_RDI = *in_RDI + 1;
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*(byte *)*in_RDI] & 0x2000) != 0) {
          *in_RDI = *in_RDI + 1;
        }
      } while (*(char *)*in_RDI != ']');
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*(byte *)*in_RDI] & 0x2000) != 0) {
        *in_RDI = *in_RDI + 1;
      }
      if (*(char *)*in_RDI == ']') {
        json_array_get_count(array);
        JVar1 = json_array_resize(array_00,(size_t)array);
        if (JVar1 == 0) {
          *in_RDI = *in_RDI + 1;
          return local_8;
        }
      }
      json_value_free((JSON_Value *)array);
      local_8 = (JSON_Value *)0x0;
    }
  }
  else {
    json_value_free(value);
    local_8 = (JSON_Value *)0x0;
  }
  return local_8;
}

Assistant:

static JSON_Value * parse_array_value(const char **string, size_t nesting) {
    JSON_Value *output_value = NULL, *new_array_value = NULL;
    JSON_Array *output_array = NULL;
    output_value = json_value_init_array();
    if (output_value == NULL) {
        return NULL;
    }
    if (**string != '[') {
        json_value_free(output_value);
        return NULL;
    }
    output_array = json_value_get_array(output_value);
    SKIP_CHAR(string);
    SKIP_WHITESPACES(string);
    if (**string == ']') { /* empty array */
        SKIP_CHAR(string);
        return output_value;
    }
    while (**string != '\0') {
        new_array_value = parse_value(string, nesting);
        if (new_array_value == NULL) {
            json_value_free(output_value);
            return NULL;
        }
        if (json_array_add(output_array, new_array_value) != JSONSuccess) {
            json_value_free(new_array_value);
            json_value_free(output_value);
            return NULL;
        }
        SKIP_WHITESPACES(string);
        if (**string != ',') {
            break;
        }
        SKIP_CHAR(string);
        SKIP_WHITESPACES(string);
        if (**string == ']') {
            break;
        }
    }
    SKIP_WHITESPACES(string);
    if (**string != ']' || /* Trim array after parsing is over */
        json_array_resize(output_array, json_array_get_count(output_array)) != JSONSuccess) {
            json_value_free(output_value);
            return NULL;
    }
    SKIP_CHAR(string);
    return output_value;
}